

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O1

wchar_t pm_w(wchar_t *p,wchar_t *s,wchar_t flags)

{
  bool bVar1;
  bool bVar2;
  wchar_t wVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  bool bVar8;
  
  if ((*s == L'.') && (s[1] == L'/')) {
    do {
      do {
        pwVar5 = s;
        s = pwVar5 + 1;
      } while (*s == L'/');
    } while ((*s == L'.') && ((wVar3 = pwVar5[2], wVar3 == L'/' || (wVar3 == L'\0'))));
  }
  if ((*p == L'.') && (p[1] == L'/')) {
    do {
      do {
        pwVar5 = p;
        p = pwVar5 + 1;
      } while (*p == L'/');
    } while ((*p == L'.') && ((wVar3 = pwVar5[2], wVar3 == L'/' || (wVar3 == L'\0'))));
  }
LAB_001373f8:
  wVar3 = *p;
  if (L'>' < wVar3) {
    if (wVar3 == L'?') {
      if (*s == L'\0') goto LAB_001376a1;
    }
    else {
      if (wVar3 == L'[') {
        pwVar5 = p + 1;
        pwVar4 = pwVar5;
        do {
          wVar6 = *pwVar4;
          if (wVar6 == L'\\') {
            if (pwVar4[1] != L'\0') {
              pwVar4 = pwVar4 + 1;
            }
          }
          else {
            if (wVar6 == L'\0') goto LAB_001375e0;
            if (wVar6 == L']') goto LAB_00137525;
          }
          pwVar4 = pwVar4 + 1;
        } while( true );
      }
      if (wVar3 != L'\\') goto LAB_001375e0;
      if (p[1] == L'\0') {
        if (*s != L'\\') goto LAB_001376a1;
      }
      else {
        if (p[1] != *s) goto LAB_001376a1;
        p = p + 1;
      }
    }
    goto LAB_001375eb;
  }
  if (L')' < wVar3) {
    if (wVar3 == L'/') {
      if ((*s == L'/') || (*s == L'\0')) {
        for (p = p + -1;
            (wVar3 = p[1], wVar3 == L'/' || ((wVar3 == L'.' && ((p[2] == L'/' || (p[2] == L'\0')))))
            ); p = p + 1) {
        }
        for (s = s + -1; (s[1] == L'/' || ((s[1] == L'.' && ((s[2] == L'/' || (s[2] == L'\0'))))));
            s = s + 1) {
        }
        if (((flags & 2U) == 0) || (wVar3 != L'\0')) goto LAB_001375eb;
        goto LAB_00137640;
      }
      goto LAB_001376a1;
    }
    if (wVar3 == L'*') goto LAB_00137634;
LAB_001375e0:
    if (wVar3 == *s) goto LAB_001375eb;
    goto LAB_001376a1;
  }
  if (wVar3 == L'$') {
    if (((flags & 2U) != 0) && (p[1] == L'\0')) goto LAB_0013761b;
    goto LAB_001375e0;
  }
  if (wVar3 != L'\0') goto LAB_001375e0;
  if (*s != L'/') goto LAB_00137674;
  bVar8 = true;
  if ((flags & 2U) != 0) goto LAB_001376a3;
  for (; (*s == L'/' || ((*s == L'.' && ((s[1] == L'/' || (s[1] == L'\0')))))); s = s + 1) {
  }
LAB_00137674:
  wVar3 = *s;
LAB_00137677:
  bVar8 = wVar3 == L'\0';
LAB_001376a3:
  return (wchar_t)bVar8;
LAB_00137525:
  bVar2 = false;
  bVar8 = true;
  if (((*pwVar5 == L'^') || (*pwVar5 == L'!')) && (pwVar5 < pwVar4)) {
    pwVar5 = p + 2;
    bVar2 = true;
    bVar8 = false;
  }
  bVar1 = bVar2;
  if (pwVar5 < pwVar4) {
    wVar3 = *s;
    wVar6 = L'\0';
    do {
      bVar1 = bVar8;
      if (*pwVar5 == L'\\') {
        pwVar5 = pwVar5 + 1;
LAB_0013758e:
        wVar6 = *pwVar5;
        if (wVar6 == wVar3) break;
      }
      else {
        if (*pwVar5 != L'-') goto LAB_0013758e;
        if ((wVar6 == L'\0') || (pwVar5 == pwVar4 + -1)) {
          if (wVar3 == L'-') break;
        }
        else {
          wVar7 = pwVar5[1];
          if (wVar7 == L'\\') {
            wVar7 = pwVar5[2];
            pwVar5 = pwVar5 + 2;
          }
          else {
            pwVar5 = pwVar5 + 1;
          }
          if (wVar3 <= wVar7 && wVar6 <= wVar3) break;
        }
        wVar6 = L'\0';
      }
      pwVar5 = pwVar5 + 1;
      bVar1 = bVar2;
    } while (pwVar5 < pwVar4);
  }
  p = pwVar4;
  if (!bVar1) goto LAB_001376a1;
LAB_001375eb:
  p = p + 1;
  s = s + 1;
  goto LAB_001373f8;
LAB_0013761b:
  do {
    do {
      pwVar5 = s + 1;
      wVar3 = *s;
      s = pwVar5;
    } while (wVar3 == L'/');
  } while ((wVar3 == L'.') && ((*pwVar5 == L'/' || (*pwVar5 == L'\0'))));
  goto LAB_00137677;
LAB_00137634:
  for (; *p == L'*'; p = p + 1) {
  }
  if (*p == L'\0') {
LAB_00137640:
    bVar8 = true;
  }
  else if (*s == L'\0') {
LAB_001376a1:
    bVar8 = false;
  }
  else {
    do {
      wVar3 = __archive_pathmatch_w(p,s,flags);
      bVar8 = wVar3 != L'\0';
      if (bVar8) break;
      pwVar5 = s + 1;
      s = s + 1;
    } while (*pwVar5 != L'\0');
  }
  goto LAB_001376a3;
}

Assistant:

static int
pm_w(const wchar_t *p, const wchar_t *s, int flags)
{
	const wchar_t *end;

	/*
	 * Ignore leading './', './/', '././', etc.
	 */
	if (s[0] == L'.' && s[1] == L'/')
		s = pm_slashskip_w(s + 1);
	if (p[0] == L'.' && p[1] == L'/')
		p = pm_slashskip_w(p + 1);

	for (;;) {
		switch (*p) {
		case L'\0':
			if (s[0] == L'/') {
				if (flags & PATHMATCH_NO_ANCHOR_END)
					return (1);
				/* "dir" == "dir/" == "dir/." */
				s = pm_slashskip_w(s);
			}
			return (*s == L'\0');
		case L'?':
			/* ? always succeeds, unless we hit end of 's' */
			if (*s == L'\0')
				return (0);
			break;
		case L'*':
			/* "*" == "**" == "***" ... */
			while (*p == L'*')
				++p;
			/* Trailing '*' always succeeds. */
			if (*p == L'\0')
				return (1);
			while (*s) {
				if (archive_pathmatch_w(p, s, flags))
					return (1);
				++s;
			}
			return (0);
		case L'[':
			/*
			 * Find the end of the [...] character class,
			 * ignoring \] that might occur within the class.
			 */
			end = p + 1;
			while (*end != L'\0' && *end != L']') {
				if (*end == L'\\' && end[1] != L'\0')
					++end;
				++end;
			}
			if (*end == L']') {
				/* We found [...], try to match it. */
				if (!pm_list_w(p + 1, end, *s, flags))
					return (0);
				p = end; /* Jump to trailing ']' char. */
				break;
			} else
				/* No final ']', so just match '['. */
				if (*p != *s)
					return (0);
			break;
		case L'\\':
			/* Trailing '\\' matches itself. */
			if (p[1] == L'\0') {
				if (*s != L'\\')
					return (0);
			} else {
				++p;
				if (*p != *s)
					return (0);
			}
			break;
		case L'/':
			if (*s != L'/' && *s != L'\0')
				return (0);
			/* Note: pattern "/\./" won't match "/";
			 * pm_slashskip() correctly stops at backslash. */
			p = pm_slashskip_w(p);
			s = pm_slashskip_w(s);
			if (*p == L'\0' && (flags & PATHMATCH_NO_ANCHOR_END))
				return (1);
			--p; /* Counteract the increment below. */
			--s;
			break;
		case L'$':
			/* '$' is special only at end of pattern and only
			 * if PATHMATCH_NO_ANCHOR_END is specified. */
			if (p[1] == L'\0' && (flags & PATHMATCH_NO_ANCHOR_END)){
				/* "dir" == "dir/" == "dir/." */
				return (*pm_slashskip_w(s) == L'\0');
			}
			/* Otherwise, '$' is not special. */
			/* FALL THROUGH */
		default:
			if (*p != *s)
				return (0);
			break;
		}
		++p;
		++s;
	}
}